

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O2

jsmntok_t * jsmn_alloc_token(jsmn_parser *parser,jsmntok_t *tokens,size_t num_tokens)

{
  jsmntok_t *pjVar1;
  ulong uVar2;
  
  uVar2 = (ulong)parser->toknext;
  if (uVar2 < num_tokens) {
    parser->toknext = parser->toknext + 1;
    pjVar1 = tokens + uVar2;
    pjVar1->start = -1;
    pjVar1->end = -1;
    *(undefined8 *)(&pjVar1->start + 2) = 0xffffffff00000000;
    return tokens + uVar2;
  }
  return (jsmntok_t *)0x0;
}

Assistant:

static jsmntok_t *jsmn_alloc_token(jsmn_parser *parser,
				   jsmntok_t *tokens, size_t num_tokens) {
	jsmntok_t *tok;
	if (parser->toknext >= num_tokens) {
		return NULL;
	}
	tok = &tokens[parser->toknext++];
	tok->start = tok->end = -1;
	tok->size = 0;
#ifdef JSMN_PARENT_LINKS
	tok->parent = -1;
#endif
	return tok;
}